

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O0

void test_one<std::vector<long,std::allocator<long>>,k_ary_constructor<long>>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempt_count,
               k_ary_constructor<long> *constructor)

{
  bool bVar1;
  const_iterator first;
  const_iterator last;
  clock_t cVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference value;
  reference plVar5;
  runtime_error *this;
  ostream *poVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_a0 [3];
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_88;
  iterator search_result;
  clock_t attempt_time;
  value_type *element;
  size_t attempt;
  clock_t search_time;
  undefined1 local_50 [8];
  k_ary_search_set<long,_std::less<void>_> set;
  clock_t creation_time;
  k_ary_constructor<long> *constructor_local;
  size_t attempt_count_local;
  vector<long,_std::allocator<long>_> *numbers_local;
  
  set._32_8_ = clock();
  first = std::vector<long,_std::allocator<long>_>::begin(numbers);
  last = std::vector<long,_std::allocator<long>_>::end(numbers);
  k_ary_constructor<long>::operator()
            ((k_ary_search_set<long,_std::less<void>_> *)local_50,constructor,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             first._M_current,
             (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
             last._M_current);
  cVar2 = clock();
  set._32_8_ = cVar2 - set._32_8_;
  attempt = 0;
  element = (value_type *)0x0;
  while( true ) {
    if (attempt_count <= element) {
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2a844);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)(long)set._32_8_ / 1000000.0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2a85d);
      auVar8._8_4_ = (int)(attempt_count >> 0x20);
      auVar8._0_8_ = attempt_count;
      auVar8._12_4_ = 0x45300000;
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,((double)(long)attempt /
                                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)attempt_count) -
                                 4503599627370496.0))) / 1000000.0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      burst::k_ary_search_set<long,_std::less<void>_>::~k_ary_search_set
                ((k_ary_search_set<long,_std::less<void>_> *)local_50);
      return;
    }
    uVar3 = random();
    sVar4 = std::vector<long,_std::allocator<long>_>::size(numbers);
    value = std::vector<long,_std::allocator<long>_>::operator[](numbers,uVar3 % sVar4);
    search_result._M_current = (long *)clock();
    local_88._M_current =
         (long *)burst::k_ary_search_set<long,_std::less<void>_>::find
                           ((k_ary_search_set<long,_std::less<void>_> *)local_50,value);
    cVar2 = clock();
    search_result._M_current = cVar2 - search_result._M_current;
    local_a0[0]._M_current =
         (long *)burst::k_ary_search_set<long,_std::less<void>_>::end
                           ((k_ary_search_set<long,_std::less<void>_> *)local_50);
    bVar1 = __gnu_cxx::operator==(&local_88,local_a0);
    bVar7 = true;
    if (!bVar1) {
      plVar5 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_88);
      bVar7 = *plVar5 != *value;
    }
    if (bVar7) break;
    attempt = (long)search_result._M_current + attempt;
    element = (value_type *)((long)element + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,anon_var_dwarf_2a82b);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_one (const Container & numbers, std::size_t attempt_count, const SetConstructor & constructor)
{
    clock_t creation_time = clock();
    auto set = constructor(numbers.begin(), numbers.end());
    creation_time = clock() - creation_time;

    clock_t search_time = 0;
    for (std::size_t attempt = 0; attempt < attempt_count; ++attempt)
    {
        const auto & element = numbers[static_cast<std::size_t>(random()) % numbers.size()];

        clock_t attempt_time = clock();
        auto search_result = set.find(element);
        attempt_time = clock() - attempt_time;

        if (search_result == set.end() || *search_result != element)
        {
            throw std::runtime_error("Нашлись не все искомые элементы.");
        }

        search_time += attempt_time;
    }

    std::cout << "\tВремя создания: " << static_cast<double>(creation_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время поиска: " << static_cast<double>(search_time) / static_cast<double>(attempt_count) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}